

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cpp
# Opt level: O2

void __thiscall CHIP8::initialise(CHIP8 *this)

{
  int i;
  long lVar1;
  time_t tVar2;
  
  this->opcode = 0;
  this->I = 0;
  this->pc = 0x200;
  this->sp = 0;
  this->delayTimer = '\0';
  this->soundTimer = '\0';
  for (lVar1 = -0x10; lVar1 != 0; lVar1 = lVar1 + 1) {
    this->stack[lVar1 + 0x10] = 0;
    this->memory[lVar1] = '\0';
    *(undefined1 *)((long)this->stack + lVar1 + -8) = 0;
  }
  for (lVar1 = 0; lVar1 != 0x800; lVar1 = lVar1 + 1) {
    this->graphics[lVar1] = '\0';
  }
  for (lVar1 = 0; lVar1 != 0x1000; lVar1 = lVar1 + 1) {
    this->memory[lVar1] = '\0';
  }
  for (lVar1 = 0; lVar1 != 0x50; lVar1 = lVar1 + 1) {
    this->memory[lVar1] = CHIP8Fontset[lVar1];
  }
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  return;
}

Assistant:

void CHIP8::initialise(){

    opcode     = 0;
    I          = 0;
    pc         = 0x200;
    sp         = 0;
    delayTimer = 0;
    soundTimer = 0;

    for (int i = 0; i < 16; ++i){
        stack[i] = 0;
        R[i]     = 0;
        key[i]   = 0;
    }

    for (int i = 0; i < 64 * 32; ++i){
        graphics[i] = 0;
    }

    for (int i = 0; i < 4096; ++i){
        memory[i] = 0;
    }

    for (int i = 0; i < 80; ++i){
        memory[i] = CHIP8Fontset[i];
    }

    srand(time(0));
}